

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavMoveRequestSubmit
               (ImGuiDir move_dir,ImGuiDir clip_dir,ImGuiNavMoveFlags move_flags,
               ImGuiScrollFlags scroll_flags)

{
  ImGuiContext *pIVar1;
  ImGuiScrollFlags in_ECX;
  uint in_EDX;
  ImGuiDir in_ESI;
  ImGuiDir in_EDI;
  ImGuiContext *g;
  uint local_c;
  
  pIVar1 = GImGui;
  local_c = in_EDX;
  if ((in_EDX & 0x400) != 0) {
    local_c = in_EDX | 0x10;
  }
  GImGui->NavMoveScoringItems = true;
  pIVar1->NavMoveSubmitted = true;
  pIVar1->NavMoveDir = in_EDI;
  pIVar1->NavMoveDirForDebug = in_EDI;
  pIVar1->NavMoveClipDir = in_ESI;
  pIVar1->NavMoveFlags = local_c;
  pIVar1->NavMoveScrollFlags = in_ECX;
  pIVar1->NavMoveForwardToNextFrame = false;
  pIVar1->NavMoveKeyMods = (pIVar1->IO).KeyMods;
  pIVar1->NavTabbingCounter = 0;
  ImGuiNavItemData::Clear(&pIVar1->NavMoveResultLocal);
  ImGuiNavItemData::Clear(&pIVar1->NavMoveResultLocalVisible);
  ImGuiNavItemData::Clear(&pIVar1->NavMoveResultOther);
  NavUpdateAnyRequestFlag();
  return;
}

Assistant:

void ImGui::NavMoveRequestSubmit(ImGuiDir move_dir, ImGuiDir clip_dir, ImGuiNavMoveFlags move_flags, ImGuiScrollFlags scroll_flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);

    if (move_flags & ImGuiNavMoveFlags_Tabbing)
        move_flags |= ImGuiNavMoveFlags_AllowCurrentNavId;

    g.NavMoveSubmitted = g.NavMoveScoringItems = true;
    g.NavMoveDir = move_dir;
    g.NavMoveDirForDebug = move_dir;
    g.NavMoveClipDir = clip_dir;
    g.NavMoveFlags = move_flags;
    g.NavMoveScrollFlags = scroll_flags;
    g.NavMoveForwardToNextFrame = false;
    g.NavMoveKeyMods = g.IO.KeyMods;
    g.NavTabbingCounter = 0;
    g.NavMoveResultLocal.Clear();
    g.NavMoveResultLocalVisible.Clear();
    g.NavMoveResultOther.Clear();
    NavUpdateAnyRequestFlag();
}